

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fIntegerStateQueryTests.cpp
# Opt level: O2

void __thiscall
deqp::gles2::Functional::anon_unknown_2::ImplementationColorReadTestCase::test
          (ImplementationColorReadTestCase *this)

{
  bool bVar1;
  long lVar2;
  vector<int,_std::allocator<int>_> validColorFormats;
  vector<int,_std::allocator<int>_> validColorTypes;
  GLint defaultColorFormats [3];
  GLint defaultColorTypes [4];
  int local_7c;
  _Vector_base<int,_std::allocator<int>_> local_78;
  _Vector_base<int,_std::allocator<int>_> local_58;
  value_type_conflict1 local_38 [4];
  value_type_conflict1 local_28 [4];
  
  local_28[0] = 0x1401;
  local_28[1] = 0x8033;
  local_28[2] = 0x8034;
  local_28[3] = 0x8363;
  local_38[0] = 0x1908;
  local_38[1] = 0x1907;
  local_38[2] = 0x1906;
  local_58._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_58._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_78._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  for (lVar2 = 0; lVar2 != 0x10; lVar2 = lVar2 + 4) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_58,
               (value_type_conflict1 *)((long)local_28 + lVar2));
  }
  for (lVar2 = 0; lVar2 != 0xc; lVar2 = lVar2 + 4) {
    std::vector<int,_std::allocator<int>_>::push_back
              ((vector<int,_std::allocator<int>_> *)&local_78,
               (value_type_conflict1 *)((long)local_38 + lVar2));
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_EXT_texture_format_BGRA8888");
  if (!bVar1) {
    bVar1 = glu::ContextInfo::isExtensionSupported
                      (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                       "GL_APPLE_texture_format_BGRA8888");
    if (!bVar1) goto LAB_00ee7839;
  }
  local_7c = 0x80e1;
  std::vector<int,_std::allocator<int>_>::emplace_back<int>
            ((vector<int,_std::allocator<int>_> *)&local_78,&local_7c);
LAB_00ee7839:
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_EXT_read_format_bgra");
  if (bVar1) {
    local_7c = 0x80e1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_78,&local_7c);
    local_7c = 0x8365;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_58,&local_7c);
    local_7c = 0x8366;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_58,&local_7c);
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_IMG_read_format");
  if (bVar1) {
    local_7c = 0x80e1;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_78,&local_7c);
    local_7c = 0x8365;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_58,&local_7c);
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_NV_sRGB_formats");
  if (bVar1) {
    local_7c = 0x8c46;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_78,&local_7c);
    local_7c = 0x8c44;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_78,&local_7c);
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,"GL_NV_bgr");
  if (bVar1) {
    local_7c = 0x80e0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_78,&local_7c);
  }
  bVar1 = glu::ContextInfo::isExtensionSupported
                    (((this->super_ApiCase).super_TestCase.m_context)->m_contextInfo,
                     "GL_EXT_texture_rg");
  if (bVar1) {
    local_7c = 0x1903;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_78,&local_7c);
    local_7c = 0x8227;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              ((vector<int,_std::allocator<int>_> *)&local_78,&local_7c);
  }
  (*this->m_verifier->_vptr_StateVerifier[8])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8b9a,
             local_58._M_impl.super__Vector_impl_data._M_start,
             (long)local_58._M_impl.super__Vector_impl_data._M_finish -
             (long)local_58._M_impl.super__Vector_impl_data._M_start >> 2);
  (*this->m_verifier->_vptr_StateVerifier[8])
            (this->m_verifier,
             (this->super_ApiCase).super_TestCase.super_TestCase.super_TestNode.m_testCtx,0x8b9b,
             local_78._M_impl.super__Vector_impl_data._M_start,
             (long)local_78._M_impl.super__Vector_impl_data._M_finish -
             (long)local_78._M_impl.super__Vector_impl_data._M_start >> 2);
  ApiCase::expectError(&this->super_ApiCase,0);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_78);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_58);
  return;
}

Assistant:

void test (void)
	{
		const GLint defaultColorTypes[] =
		{
			GL_UNSIGNED_BYTE, GL_UNSIGNED_SHORT_4_4_4_4, GL_UNSIGNED_SHORT_5_5_5_1, GL_UNSIGNED_SHORT_5_6_5
		};
		const GLint defaultColorFormats[] =
		{
			GL_RGBA, GL_RGB, GL_ALPHA
		};

		std::vector<GLint> validColorTypes;
		std::vector<GLint> validColorFormats;

		// Defined by the spec

		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(defaultColorTypes); ++ndx)
			validColorTypes.push_back(defaultColorTypes[ndx]);
		for (int ndx = 0; ndx < DE_LENGTH_OF_ARRAY(defaultColorFormats); ++ndx)
			validColorFormats.push_back(defaultColorFormats[ndx]);

		// Extensions

		if (m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_format_BGRA8888") ||
			m_context.getContextInfo().isExtensionSupported("GL_APPLE_texture_format_BGRA8888"))
			validColorFormats.push_back(GL_BGRA);

		if (m_context.getContextInfo().isExtensionSupported("GL_EXT_read_format_bgra"))
		{
			validColorFormats.push_back(GL_BGRA);
			validColorTypes.push_back(GL_UNSIGNED_SHORT_4_4_4_4_REV);
			validColorTypes.push_back(GL_UNSIGNED_SHORT_1_5_5_5_REV);
		}

		if (m_context.getContextInfo().isExtensionSupported("GL_IMG_read_format"))
		{
			validColorFormats.push_back(GL_BGRA);
			validColorTypes.push_back(GL_UNSIGNED_SHORT_4_4_4_4_REV);
		}

		if (m_context.getContextInfo().isExtensionSupported("GL_NV_sRGB_formats"))
		{
			validColorFormats.push_back(GL_SLUMINANCE_NV);
			validColorFormats.push_back(GL_SLUMINANCE_ALPHA_NV);
		}

		if (m_context.getContextInfo().isExtensionSupported("GL_NV_bgr"))
		{
			validColorFormats.push_back(GL_BGR_NV);
		}

		if (m_context.getContextInfo().isExtensionSupported("GL_EXT_texture_rg"))
		{
			validColorFormats.push_back(GL_RED);
			validColorFormats.push_back(GL_RG);
		}

		m_verifier->verifyIntegerAnyOf(m_testCtx, GL_IMPLEMENTATION_COLOR_READ_TYPE,	&validColorTypes[0],	validColorTypes.size());
		m_verifier->verifyIntegerAnyOf(m_testCtx, GL_IMPLEMENTATION_COLOR_READ_FORMAT,	&validColorFormats[0],	validColorFormats.size());
		expectError(GL_NO_ERROR);
	}